

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O2

bool __thiscall
BamTools::Internal::BamToolsIndex::HasAlignments(BamToolsIndex *this,int *referenceID)

{
  int iVar1;
  const_reference pvVar2;
  
  iVar1 = *referenceID;
  if ((-1 < (long)iVar1) &&
     (iVar1 < (int)((ulong)((long)(this->m_indexFileSummary).
                                  super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_indexFileSummary).
                                 super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
    pvVar2 = std::
             vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
             ::at(&this->m_indexFileSummary,(long)iVar1);
    return 0 < pvVar2->NumBlocks;
  }
  return false;
}

Assistant:

bool BamToolsIndex::HasAlignments(const int& referenceID) const
{
    if (referenceID < 0 || referenceID >= (int)m_indexFileSummary.size()) return false;
    const BtiReferenceSummary& refSummary = m_indexFileSummary.at(referenceID);
    return (refSummary.NumBlocks > 0);
}